

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::flags_internal::AbslParseFlag
          (flags_internal *this,string_view text,short *dst,string *param_3)

{
  bool bVar1;
  string_view text_00;
  int val;
  int local_c;
  
  text_00._M_len = text._M_len;
  text_00._M_str = (char *)&local_c;
  bVar1 = ParseFlagImpl<int>(this,text_00,(int *)dst);
  if ((bVar1) && ((short)local_c == local_c)) {
    *(short *)text._M_str = (short)local_c;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AbslParseFlag(absl::string_view text, short* dst, std::string*) {
  int val;
  if (!ParseFlagImpl(text, val)) return false;
  if (static_cast<short>(val) != val)  // worked, but number out of range
    return false;
  *dst = static_cast<short>(val);
  return true;
}